

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDitheringTests.cpp
# Opt level: O1

IterateResult __thiscall deqp::gles2::Functional::DitheringCase::iterate(DitheringCase *this)

{
  int iVar1;
  bool bVar2;
  int i;
  int iVar3;
  long lVar4;
  char *description;
  IterateResult IVar5;
  qpTestResult testResult;
  TestContext *this_00;
  Vec4 quadColor;
  Vec4 local_28;
  
  if (this->m_patternType == PATTERNTYPE_UNICOLORED_QUAD) {
    iVar3 = tcu::CommandLine::getTestIterationCount
                      (((this->super_TestCase).super_TestNode.m_testCtx)->m_cmdLine);
    if (iVar3 < 1) {
      iVar3 = 0x1d;
    }
    else {
      iVar3 = tcu::CommandLine::getTestIterationCount
                        (((this->super_TestCase).super_TestNode.m_testCtx)->m_cmdLine);
      iVar3 = iVar3 + -1;
    }
    iVar1 = this->m_iteration;
    local_28.m_data[0] = 0.0;
    local_28.m_data[1] = 0.0;
    local_28.m_data[2] = 0.0;
    local_28.m_data[3] = 0.0;
    lVar4 = 0;
    do {
      local_28.m_data[lVar4] = (this->m_color).m_data[lVar4] * ((float)iVar1 / (float)iVar3);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    bVar2 = drawAndCheckUnicoloredQuad(this,&local_28);
    if (bVar2) {
      if (this->m_iteration != iVar3) goto LAB_00faaeee;
      this_00 = (this->super_TestCase).super_TestNode.m_testCtx;
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
LAB_00faaefb:
      this_00 = (this->super_TestCase).super_TestNode.m_testCtx;
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
    tcu::TestContext::setTestResult(this_00,testResult,description);
    IVar5 = STOP;
  }
  else {
    if (this->m_patternType == PATTERNTYPE_GRADIENT) {
      bVar2 = drawAndCheckGradient(this,this->m_iteration == 1,&this->m_color);
      if (!bVar2) goto LAB_00faaefb;
      if (this->m_iteration == 1) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
        return STOP;
      }
    }
LAB_00faaeee:
    this->m_iteration = this->m_iteration + 1;
    IVar5 = CONTINUE;
  }
  return IVar5;
}

Assistant:

DitheringCase::IterateResult DitheringCase::iterate (void)
{
	if (m_patternType == PATTERNTYPE_GRADIENT)
	{
		// Draw horizontal and vertical gradients.

		DE_ASSERT(m_iteration < 2);

		const bool success = drawAndCheckGradient(m_iteration == 1, m_color);

		if (!success)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		if (m_iteration == 1)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
			return STOP;
		}
	}
	else if (m_patternType == PATTERNTYPE_UNICOLORED_QUAD)
	{
		const int numQuads = m_testCtx.getCommandLine().getTestIterationCount() > 0 ? m_testCtx.getCommandLine().getTestIterationCount() : 30;

		DE_ASSERT(m_iteration < numQuads);

		const Vec4 quadColor	= (float)m_iteration / (float)(numQuads-1) * m_color;
		const bool success		=  drawAndCheckUnicoloredQuad(quadColor);

		if (!success)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		if (m_iteration == numQuads - 1)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
			return STOP;
		}
	}
	else
		DE_ASSERT(false);

	m_iteration++;

	return CONTINUE;
}